

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.hpp
# Opt level: O0

size_t __thiscall
poincare_disc::
Dictionary<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::put
          (Dictionary<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,key_type *key)

{
  size_type __n;
  bool bVar1;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  __x;
  pointer ppVar2;
  reference pvVar3;
  undefined1 uVar4;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_unsigned_long>_&&>::value,_pair<iterator,_bool>_>
  _Var5;
  size_t n;
  size_t n_1;
  iterator itr;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *in_stack_ffffffffffffff58;
  value_type_conflict *__x_00;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *in_stack_ffffffffffffff68;
  value_type_conflict local_58 [5];
  size_type local_30;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_28;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_20 [3];
  size_type local_8;
  
  local_20[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::find(in_stack_ffffffffffffff58,(key_type *)0x121ae1);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::end(in_stack_ffffffffffffff58);
  bVar1 = std::__detail::operator==(local_20,&local_28);
  if (bVar1) {
    local_30 = size((Dictionary<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x121b23);
    __x_00 = local_58;
    std::make_pair<std::__cxx11::string_const&,unsigned_long&>
              (&in_stack_ffffffffffffff68->first,
               (unsigned_long *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    _Var5 = std::
            unordered_map<std::__cxx11::string,unsigned_long,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
            ::insert<std::pair<std::__cxx11::string,unsigned_long>>
                      (in_RDI,in_stack_ffffffffffffff68);
    __x._M_cur = (__node_type *)
                 _Var5.first.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                 ._M_cur;
    uVar4 = _Var5.second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
             *)0x121b78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_RDI,(value_type *)__x._M_cur);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(uVar4,in_stack_ffffffffffffff60),__x_00);
    in_RDI[1]._M_h._M_single_bucket =
         (__node_base_ptr)((long)&(in_RDI[1]._M_h._M_single_bucket)->_M_nxt + 1);
    local_8 = local_30;
  }
  else {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
                           *)0x121bf1);
    __n = ppVar2->second;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        &in_RDI[1]._M_h._M_element_count,__n);
    *pvVar3 = *pvVar3 + 1;
    in_RDI[1]._M_h._M_single_bucket =
         (__node_base_ptr)((long)&(in_RDI[1]._M_h._M_single_bucket)->_M_nxt + 1);
    local_8 = __n;
  }
  return local_8;
}

Assistant:

std::size_t put(const key_type& key)
    {
        auto itr = hash_.find(key);
        if(itr == hash_.end()){
            std::size_t n = size();
            hash_.insert(std::make_pair(key, n));
            keys_.push_back(key);
            counts_.push_back(1);
            ++ntokens_;
            return n;
        } 
        std::size_t n = itr->second;
        ++counts_[n];
        ++ntokens_;
        return n;
    }